

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall Engine::solve(Engine *this,Problem *p,string *problemLabel)

{
  bool bVar1;
  RESULT RVar2;
  uint uVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar4;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> _Var5;
  Connector *this_00;
  Clause **ppCVar6;
  int *piVar7;
  mapped_type *pmVar8;
  Connector *pCVar9;
  sockaddr *__addr;
  int __fd;
  Problem *in_RSI;
  EVP_PKEY_CTX *ctx;
  Engine *in_RDI;
  double dVar10;
  int id;
  Clause *c;
  uint i;
  random_device r;
  undefined4 in_stack_ffffffffffffebc8;
  uint in_stack_ffffffffffffebcc;
  Connector *in_stack_ffffffffffffebd0;
  undefined4 in_stack_ffffffffffffebd8;
  undefined4 in_stack_ffffffffffffebdc;
  uint uVar11;
  undefined4 in_stack_ffffffffffffec08;
  random_device *in_stack_ffffffffffffec10;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  uint local_13e4;
  unsigned_long local_13b8;
  Engine *in_stack_ffffffffffffec60;
  
  in_RDI->problem = in_RSI;
  if (so.rnd_seed == 0) {
    std::random_device::random_device(in_stack_ffffffffffffec10);
    so.rnd_seed = std::random_device::operator()((random_device *)0x284cd1);
    std::random_device::~random_device((random_device *)0x284cf2);
  }
  ctx = (EVP_PKEY_CTX *)(long)so.rnd_seed;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             in_stack_ffffffffffffebd0,CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8)
            );
  (in_RDI->rnd)._M_x = local_13b8;
  init(in_RDI,ctx);
  std::chrono::_V2::steady_clock::now();
  tVar4 = std::chrono::operator+
                    ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)CONCAT44(in_stack_ffffffffffffebdc,in_stack_ffffffffffffebd8),
                     (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffebd0);
  (in_RDI->time_out).__d.__r = (rep)tVar4.__d.__r;
  std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)CONCAT44(in_stack_ffffffffffffebdc,in_stack_ffffffffffffebd8),
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffebd0);
  _Var5 = std::chrono::
          duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                     CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8));
  (in_RDI->init_time).__r = _Var5.__r;
  dVar10 = memUsed();
  in_RDI->base_memory = dVar10;
  this_00 = (Connector *)operator_new(0xb8);
  pCVar9 = this_00;
  __fd = so.cpprofiler_port;
  cpprofiler::Connector::Connector(in_stack_ffffffffffffebd0,in_stack_ffffffffffffebcc);
  profilerConnector = this_00;
  if ((so.cpprofiler_enabled & 1U) != 0) {
    cpprofiler::Connector::connect(this_00,__fd,__addr,(socklen_t)pCVar9);
  }
  if ((so.learnt_stats & 1U) != 0) {
    std::ofstream::open(learntStatsStream,0x2c06c4);
    std::operator<<((ostream *)learntStatsStream,"id,length,block");
    if ((so.learnt_stats_nogood & 1U) != 0) {
      std::operator<<((ostream *)learntStatsStream,",nogood");
    }
    std::operator<<((ostream *)learntStatsStream,",rawActivity\n");
  }
  RVar2 = search((Engine *)r.field_0._16_8_,(string *)r.field_0.field_0._M_func);
  in_RDI->status = RVar2;
  if ((in_RDI->status == RES_GUN) || (in_RDI->status == RES_LUN)) {
    if (in_RDI->solutions < 1) {
      std::operator<<(in_RDI->output_stream,"=====UNSATISFIABLE=====\n");
    }
    else {
      std::operator<<(in_RDI->output_stream,"==========\n");
    }
  }
  if ((so.learnt_stats & 1U) != 0) {
    local_13e4 = 0;
    while (uVar11 = local_13e4, uVar3 = vec<Clause_*>::size(&sat.learnts), uVar11 < uVar3) {
      ppCVar6 = vec<Clause_*>::operator[](&sat.learnts,local_13e4);
      this_01 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)*ppCVar6;
      piVar7 = Clause::clauseID((Clause *)this_01);
      pmVar8 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_01,(key_type *)CONCAT44(*piVar7,in_stack_ffffffffffffec08));
      std::operator<<((ostream *)learntStatsStream,(string *)pmVar8);
      std::operator<<((ostream *)learntStatsStream,",");
      piVar7 = Clause::rawActivity((Clause *)this_01);
      std::ostream::operator<<(learntStatsStream,*piVar7);
      std::operator<<((ostream *)learntStatsStream,"\n");
      local_13e4 = local_13e4 + 1;
    }
  }
  bVar1 = doProfiling();
  if (bVar1) {
    cpprofiler::Connector::done(in_stack_ffffffffffffebd0);
    bVar1 = cpprofiler::Connector::connected(profilerConnector);
    if (bVar1) {
      cpprofiler::Connector::disconnect((Connector *)0x285051);
    }
  }
  if (profilerConnector != (Connector *)0x0) {
    pCVar9 = profilerConnector;
    cpprofiler::Connector::~Connector((Connector *)0x28506f);
    operator_delete(pCVar9);
  }
  if (0 < so.verbosity) {
    printStats(in_stack_ffffffffffffec60);
  }
  return;
}

Assistant:

void Engine::solve(Problem* p, const std::string& problemLabel) {
	problem = p;

	// Setting the random seed
	if (so.rnd_seed == 0) {
		std::random_device r;
		so.rnd_seed = r();
	}
	rnd = std::default_random_engine(so.rnd_seed);

	init();

	time_out = chuffed_clock::now() + so.time_out;

	init_time = std::chrono::duration_cast<duration>(chuffed_clock::now() - start_time);
	base_memory = memUsed();

#ifdef HAS_PROFILER
	profilerConnector = new cpprofiler::Connector(so.cpprofiler_port);
	if (so.cpprofiler_enabled) {
		profilerConnector->connect();
	}
#endif

	/* if (so.debug) { */
	/*   for (int i = 0 ; i < 2*sat.nVars() ; i++) { */
	/*     std::cerr << "literal " << i << " is " << litString[i] << "\n"; */
	/*   } */
	/* } */

	if (so.learnt_stats) {
		learntStatsStream.open("learnt-stats.csv");
		learntStatsStream << "id,length,block";
		if (so.learnt_stats_nogood) {
			learntStatsStream << ",nogood";
		}
		learntStatsStream << ",rawActivity\n";
	}

	// sequential
	status = search(problemLabel);
	if (status == RES_GUN || status == RES_LUN) {
		if (solutions > 0) {
			(*output_stream) << "==========\n";
		} else {
			(*output_stream) << "=====UNSATISFIABLE=====\n";
		}
	}

	if (so.learnt_stats) {
		for (unsigned int i = 0; i < sat.learnts.size(); i++) {
			Clause& c = *(sat.learnts[i]);
			//        std::cerr << "clausescore," << c.clauseID() << ","
			//        << c.rawActivity() << "\n";
			const int id = c.clauseID();
			learntStatsStream << learntClauseString[id];
			learntStatsStream << ",";
			learntStatsStream << c.rawActivity();
			learntStatsStream << "\n";
		}
	}

#ifdef HAS_PROFILER
	if (doProfiling()) {
		profilerConnector->done();
		if (profilerConnector->connected()) {
			profilerConnector->disconnect();
		}
	}
	delete profilerConnector;
#endif

	if (so.verbosity >= 1) {
		printStats();
	}
}